

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O3

void __thiscall NetworkLsa::NetworkLsa(NetworkLsa *this,istream *is)

{
  uint16_t uVar1;
  iterator __position;
  undefined8 in_RAX;
  uint64_t uVar2;
  short sVar3;
  uint8_t arr [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  Lsa::Lsa(&this->super_Lsa,is);
  (this->super_Lsa)._vptr_Lsa = (_func_int **)&PTR__NetworkLsa_00120500;
  (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (this->super_Lsa).tlen;
  std::istream::read((char *)is,(long)&uStack_38);
  uVar2 = arr2num((uint8_t *)&uStack_38,'\x04');
  *(int *)&(this->super_Lsa).field_0x2c = (int)uVar2;
  sVar3 = uVar1 - 0x18;
  if (sVar3 != 0) {
    do {
      std::istream::read((char *)is,(long)&uStack_38);
      uVar2 = arr2num((uint8_t *)&uStack_38,'\x04');
      uStack_38 = CONCAT44((uint)uVar2,(undefined4)uStack_38);
      __position._M_current =
           (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->attach_routers,__position,(uint *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = (uint)uVar2;
        (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      sVar3 = sVar3 + -4;
    } while (sVar3 != 0);
  }
  this->attach_num =
       (uint32_t)
       ((ulong)((long)(this->attach_routers).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->attach_routers).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  return;
}

Assistant:

NetworkLsa::NetworkLsa(std::istream& is) : Lsa(is)
{
    uint16_t len = tlen - sizeof(LsaHeader);
    uint8_t  arr[4];
    is.read((char*)&arr, 4);
    mask = arr2num(arr, 4);
    len  = len - 4;
    while (len != 0)
    {
        is.read((char*)&arr, 4);
        attach_routers.push_back(arr2num(arr, 4));
        len = len - 4;
    }
    attach_num = attach_routers.size();
}